

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grammar.cpp
# Opt level: O2

size_t __thiscall
SGParser::Generator::Grammar::CreateTerminalVector
          (Grammar *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *pterminalVec,Lex *lex)

{
  uint *puVar1;
  _Base_ptr p_Var2;
  size_t sVar3;
  uint *puVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((lex->Lexemes).super__Vector_base<SGParser::Lexeme,_std::allocator<SGParser::Lexeme>_>._M_impl
      .super__Vector_impl_data._M_finish ==
      (lex->Lexemes).super__Vector_base<SGParser::Lexeme,_std::allocator<SGParser::Lexeme>_>._M_impl
      .super__Vector_impl_data._M_start) {
    sVar3 = 0;
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(pterminalVec);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[11]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pterminalVec,
               (char (*) [11])"TokenError");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[9]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pterminalVec,
               (char (*) [9])"TokenEOF");
    puVar1 = (lex->TokenLexemes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (puVar4 = (lex->TokenLexemes).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start; puVar4 != puVar1; puVar4 = puVar4 + 1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(pterminalVec,
                  &(lex->Lexemes).
                   super__Vector_base<SGParser::Lexeme,_std::allocator<SGParser::Lexeme>_>._M_impl.
                   super__Vector_impl_data._M_start[*puVar4].Name);
    }
    for (p_Var2 = (this->GrammarSymbols)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &(this->GrammarSymbols)._M_t._M_impl.super__Rb_tree_header;
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
      if ((p_Var2[2]._M_color & 0x40000000) != _S_red) {
        std::__cxx11::string::substr((ulong)&local_50,(ulong)(p_Var2 + 1));
        std::operator+(&local_70,"TokenError_",&local_50);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pterminalVec
                   ,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_50);
      }
    }
    sVar3 = (long)(pterminalVec->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(pterminalVec->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 5;
  }
  return sVar3;
}

Assistant:

size_t Grammar::CreateTerminalVector(std::vector<String>& pterminalVec, const Lex& lex) const {
    // Make sure there are lexemes to deal with
    if (lex.Lexemes.size() == 0u)
        return 0u;

    // Make sure the std::vector is empty
    pterminalVec.clear();

    // Add the hard-coded default terminals
    pterminalVec.emplace_back("TokenError");
    pterminalVec.emplace_back("TokenEOF");

    // Add all the lexemes
    for (const auto lexeme: lex.TokenLexemes)
        pterminalVec.push_back(lex.Lexemes[lexeme].Name);

    // Go through grammar symbols and save the named error terminals
    for (const auto& [str, prod]: GrammarSymbols)
        if (prod & ProductionMask::ErrorTerminal)
            pterminalVec.push_back("TokenError_" + str.substr(6u, str.size() - 7u));

    return pterminalVec.size();
}